

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

bool __thiscall gimage::RAWImageIO::handlesFile(RAWImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  string s;
  allocator local_28 [32];
  
  std::__cxx11::string::string((string *)&s,name,local_28);
  lVar1 = std::__cxx11::string::find((char)&s,0x26);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_28,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)local_28);
    std::__cxx11::string::~string((string *)local_28);
  }
  if (s._M_string_length < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::find((char *)&s,0x149af8);
    bVar2 = true;
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::find((char *)&s,0x149afd);
      bVar2 = lVar1 == s._M_string_length - 4;
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar2;
}

Assistant:

bool RAWImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;
  size_t pos;

  pos=s.find('&');

  if (pos != s.npos)
  {
    s=s.substr(0, pos);
  }

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.find(".raw") == s.size()-4 || s.find(".RAW") == s.size()-4)
  {
    return true;
  }

  return false;
}